

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall
cppcms::widgets::base_html_input::base_html_input(base_html_input *this,void **vtt,string *type)

{
  _func_int **pp_Var1;
  pointer pcVar2;
  
  pp_Var1 = (_func_int **)*vtt;
  this->_vptr_base_html_input = pp_Var1;
  *(void **)((long)&this->_vptr_base_html_input + (long)pp_Var1[-3]) = vtt[1];
  (this->d).ptr_ = (_data *)0x0;
  (this->type_)._M_dataplus._M_p = (pointer)&(this->type_).field_2;
  pcVar2 = (type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->type_,pcVar2,pcVar2 + type->_M_string_length);
  return;
}

Assistant:

base_html_input::base_html_input(std::string const &type) : type_(type) {}